

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrimitiveDisplayer.cpp
# Opt level: O2

GLfloat * __thiscall
PrimitiveDisplayer::vectorToArray
          (PrimitiveDisplayer *this,vector<Vec2d_*,_std::allocator<Vec2d_*>_> *vecs)

{
  long lVar1;
  undefined8 *puVar2;
  Vec2d *this_00;
  GLfloat *pGVar3;
  long lVar4;
  float fVar5;
  
  pGVar3 = (GLfloat *)operator_new__(0x20);
  lVar1 = *(long *)vecs;
  puVar2 = *(undefined8 **)(vecs + 8);
  for (lVar4 = 0; (undefined8 *)(lVar1 + lVar4) != puVar2; lVar4 = lVar4 + 8) {
    this_00 = *(Vec2d **)(lVar1 + lVar4);
    fVar5 = Vec2d::getX(this_00);
    *(float *)((long)pGVar3 + lVar4) = fVar5;
    fVar5 = Vec2d::getY(this_00);
    *(float *)((long)pGVar3 + lVar4 + 4) = fVar5;
  }
  return pGVar3;
}

Assistant:

GLfloat* PrimitiveDisplayer::vectorToArray(vector<Vec2d*>* vecs) {
    int i = 0;
    GLfloat* vertices = new GLfloat[8];
    for (auto vec : *vecs) {
        vertices[i++] = vec->getX();
        vertices[i++] = vec->getY();
    }
    return vertices;
}